

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

bool BuildLabelRE(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *parts,vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                         *expressions)

{
  pointer pbVar1;
  reference extraout_RAX;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  pointer __args;
  
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
            (expressions);
  pbVar1 = (parts->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = extraout_RAX;
  for (__args = (parts->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; __args != pbVar1; __args = __args + 1) {
    if (__args->_M_string_length != 0) {
      pvVar2 = std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
               emplace_back<std::__cxx11::string_const&>
                         ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>
                           *)expressions,__args);
    }
  }
  return SUB81(pvVar2,0);
}

Assistant:

static bool BuildLabelRE(const std::vector<std::string>& parts,
                         std::vector<cmsys::RegularExpression>& expressions)
{
  expressions.clear();
  for (const auto& p : parts) {
    if (!p.empty()) {
      expressions.emplace_back(p);
    }
  }
  return !expressions.empty();
}